

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int validate_typed_array(JSContext *ctx,JSValue this_val)

{
  int64_t iVar1;
  int iVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  iVar1 = this_val.tag;
  JVar3 = this_val.u;
  if (((int)this_val.tag != -1) || (8 < (ushort)(*(short *)((long)JVar3.ptr + 6) - 0x15U))) {
    JVar3.float64 = 0.0;
    JVar4 = JS_ThrowTypeError(ctx,"not a %s","TypedArray");
    iVar1 = JVar4.tag;
  }
  iVar2 = -1;
  if (JVar3.ptr != (void *)0x0) {
    if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar3.ptr + 0x30) + 0x18) + 0x30) + 4) == '\0'
       ) {
      iVar2 = 0;
    }
    else {
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached",iVar1);
    }
  }
  return iVar2;
}

Assistant:

static int validate_typed_array(JSContext *ctx, JSValueConst this_val)
{
    JSObject *p;
    p = get_typed_array(ctx, this_val, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return 0;
}